

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absDup.c
# Opt level: O0

Vec_Int_t * Gia_GlaCollectAssigned(Gia_Man_t *p,Vec_Int_t *vGateClasses)

{
  int iVar1;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar2;
  int local_2c;
  int Entry;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vAssigned;
  Vec_Int_t *vGateClasses_local;
  Gia_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(1000);
  local_2c = 0;
  do {
    iVar1 = Vec_IntSize(vGateClasses);
    if (iVar1 <= local_2c) {
      Vec_IntUniqify(p_00);
      return p_00;
    }
    iVar1 = Vec_IntEntry(vGateClasses,local_2c);
    if (iVar1 != 0) {
      if (iVar1 < 1) {
        __assert_fail("Entry > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absDup.c"
                      ,0x83,"Vec_Int_t *Gia_GlaCollectAssigned(Gia_Man_t *, Vec_Int_t *)");
      }
      pGVar2 = Gia_ManObj(p,local_2c);
      iVar1 = Gia_ObjId(p,pGVar2);
      Vec_IntPush(p_00,iVar1);
      iVar1 = Gia_ObjIsAnd(pGVar2);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsRo(p,pGVar2);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsConst0(pGVar2);
          if (iVar1 == 0) {
            __assert_fail("Gia_ObjIsConst0(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absDup.c"
                          ,0x8d,"Vec_Int_t *Gia_GlaCollectAssigned(Gia_Man_t *, Vec_Int_t *)");
          }
        }
        else {
          pGVar2 = Gia_ObjRoToRi(p,pGVar2);
          iVar1 = Gia_ObjFaninId0p(p,pGVar2);
          Vec_IntPush(p_00,iVar1);
        }
      }
      else {
        iVar1 = Gia_ObjFaninId0p(p,pGVar2);
        Vec_IntPush(p_00,iVar1);
        iVar1 = Gia_ObjFaninId1p(p,pGVar2);
        Vec_IntPush(p_00,iVar1);
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Gia_GlaCollectAssigned( Gia_Man_t * p, Vec_Int_t * vGateClasses )
{
    Vec_Int_t * vAssigned;
    Gia_Obj_t * pObj;
    int i, Entry;
    vAssigned = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( vGateClasses, Entry, i )
    {
        if ( Entry == 0 )
            continue;
        assert( Entry > 0 );
        pObj = Gia_ManObj( p, i );
        Vec_IntPush( vAssigned, Gia_ObjId(p, pObj) );
        if ( Gia_ObjIsAnd(pObj) )
        {
            Vec_IntPush( vAssigned, Gia_ObjFaninId0p(p, pObj) );
            Vec_IntPush( vAssigned, Gia_ObjFaninId1p(p, pObj) );
        }
        else if ( Gia_ObjIsRo(p, pObj) )
            Vec_IntPush( vAssigned, Gia_ObjFaninId0p(p, Gia_ObjRoToRi(p, pObj)) );
        else assert( Gia_ObjIsConst0(pObj) );
    }
    Vec_IntUniqify( vAssigned );
    return vAssigned;
}